

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

int gai_ComputeCountWithSkip
              (Integer ndim,Integer *lo,Integer *hi,Integer *skip,int *count,Integer *nstride)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  *count = 1;
  uVar2 = ndim & 0xffffffff;
  if ((int)ndim < 1) {
    uVar2 = 0;
  }
  lVar3 = 1;
  while( true ) {
    if (lVar3 - uVar2 == 1) {
      *nstride = lVar3;
      return 1;
    }
    uVar1 = hi[lVar3 + -1] - lo[lVar3 + -1];
    if ((long)uVar1 < 0) break;
    if (1 < skip[lVar3 + -1]) {
      uVar1 = uVar1 / (ulong)skip[lVar3 + -1];
    }
    count[lVar3] = (int)uVar1 + 1;
    lVar3 = lVar3 + 1;
  }
  return 0;
}

Assistant:

int gai_ComputeCountWithSkip(Integer ndim, Integer *lo, Integer *hi,
                             Integer *skip, int *count, Integer *nstride)
{
#if 1
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  count[0]=1;
  istride++;
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#else
  Integer idx;
  int i, istride = 0;
  /*
  if (GAme==0) {
    printf("p[%d] ComputeCount lo[0]: %d hi[0]: %d lo[1]: %d hi[1]: %d\n",GAme,
        lo[0],hi[0],lo[1],hi[1]);
  }
  */
  for (i=0; i<(int)ndim; i++) {
    idx = hi[i] - lo[i];
    if (idx < 0) return 0;
    if (skip[i] > 1) {
      count[istride] = 1;
      istride++;
      count[istride] = (int)(idx/skip[i]+1);
      istride++;
    } else {
      count[istride] = (int)idx+1;
      istride++;
    }
  }
  *nstride = istride;
  return 1;
#endif
}